

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

void prepare_pragma_string(char *repr,VARR_char *to)

{
  char cVar1;
  VARR_token_t *pVVar2;
  parse_ctx *ppVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  ulong uVar7;
  char *pcVar8;
  size_t sVar9;
  node *pnVar10;
  VARR_char *pVVar11;
  c2m_ctx_t c2m_ctx;
  ulong uVar12;
  VARR_char *__size;
  
  pVVar11 = to;
  c2m_ctx = (c2m_ctx_t)repr;
  sVar6 = strlen(repr);
  if ((to != (VARR_char *)0x0) && (to->varr != (char *)0x0)) {
    to->els_num = 0;
    iVar4 = (int)sVar6;
    if ((iVar4 != 0) && (cVar1 = *repr, cVar1 != '\"' || iVar4 != 1)) {
      pVVar11 = (VARR_char *)(long)(iVar4 + -1);
      uVar5 = iVar4 - (uint)(repr[(long)pVVar11] == '\"');
      if ((int)(uint)(cVar1 == '\"') < (int)uVar5) {
        uVar7 = (ulong)(cVar1 == '\"');
        do {
          uVar12 = uVar7 + 1;
          cVar1 = repr[uVar7];
          if (((cVar1 != '\\') || ((long)(int)uVar5 <= (long)uVar12)) ||
             ((repr[uVar12] != '\"' && (repr[uVar12] != '\\')))) {
            c2m_ctx = (c2m_ctx_t)to->varr;
            if (c2m_ctx == (c2m_ctx_t)0x0) {
              prepare_pragma_string_cold_1();
              goto LAB_00196456;
            }
            uVar7 = to->els_num + 1;
            if (to->size < uVar7) {
              __size = (VARR_char *)((uVar7 >> 1) + uVar7);
              pVVar11 = __size;
              pcVar8 = (char *)realloc(c2m_ctx,(size_t)__size);
              to->varr = pcVar8;
              to->size = (size_t)__size;
            }
            sVar9 = to->els_num;
            to->els_num = sVar9 + 1;
            to->varr[sVar9] = cVar1;
          }
          uVar7 = uVar12;
        } while ((1 - (ulong)uVar5) + uVar12 != 1);
      }
    }
    reverse(to);
    return;
  }
LAB_00196456:
  prepare_pragma_string_cold_2();
  pVVar2 = c2m_ctx->recorded_tokens;
  if ((pVVar2 != (VARR_token_t *)0x0) && (pVVar2->varr != (token_t *)0x0)) {
    ppVar3 = c2m_ctx->parse_ctx;
    pVVar11 = (VARR_char *)ppVar3->next_token_index;
    if (pVVar11 < (VARR_char *)pVVar2->els_num) {
      ppVar3->curr_token = pVVar2->varr[(long)pVVar11];
      ppVar3->next_token_index = (size_t)((long)&pVVar11->els_num + 1);
      return;
    }
  }
  read_token_cold_1();
  sVar9 = record_start(c2m_ctx);
  pnVar10 = (node *)(*(code *)pVVar11)(c2m_ctx,1);
  record_stop(c2m_ctx,sVar9,(uint)(pnVar10 == &err_struct));
  return;
}

Assistant:

static void prepare_pragma_string (const char *repr, VARR (char) * to) {
  destringify (repr, to);
  reverse (to);
}